

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void AMPLS__internal__Close(AMPLS_MP_Solver *slv)

{
  undefined8 *in_RDI;
  AMPLS_MP__internal_T *this;
  
  this = (AMPLS_MP__internal_T *)*in_RDI;
  if (this != (AMPLS_MP__internal_T *)0x0) {
    AMPLS_MP__internal_T::~AMPLS_MP__internal_T(this);
    operator_delete(this,0xb8);
  }
  if (in_RDI != (undefined8 *)0x0) {
    operator_delete(in_RDI,0x18);
  }
  return;
}

Assistant:

void AMPLS__internal__Close(AMPLS_MP_Solver* slv) {
  assert(slv->internal_info_);
  delete (AMPLS_MP__internal*)slv->internal_info_;
  delete slv;
}